

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString * __thiscall SimpleString::operator+=(SimpleString *this,char *rhs)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t bufferSize;
  
  sVar1 = size(this);
  sVar2 = StrLen(rhs);
  bufferSize = sVar2 + sVar1 + 1;
  pcVar3 = copyToNewBuffer(this->buffer_,bufferSize);
  StrNCpy(pcVar3 + sVar1,rhs,sVar2 + 1);
  deallocateInternalBuffer(this);
  this->bufferSize_ = bufferSize;
  this->buffer_ = pcVar3;
  return this;
}

Assistant:

SimpleString& SimpleString::operator+=(const char* rhs)
{
    size_t originalSize = this->size();
    size_t additionalStringSize = StrLen(rhs) + 1;
    size_t sizeOfNewString = originalSize + additionalStringSize;
    char* tbuffer = copyToNewBuffer(this->getBuffer(), sizeOfNewString);
    StrNCpy(tbuffer + originalSize, rhs, additionalStringSize);

    setInternalBufferTo(tbuffer, sizeOfNewString);
    return *this;
}